

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

uint32_t get_meta_pos(lyd_meta *meta)

{
  lyd_meta *local_20;
  lyd_meta *meta2;
  uint32_t pos;
  lyd_meta *meta_local;
  
  meta2._4_4_ = 0;
  for (local_20 = meta->parent->meta; local_20 != (lyd_meta *)0x0 && local_20 != meta;
      local_20 = local_20->next) {
    meta2._4_4_ = meta2._4_4_ + 1;
  }
  if (local_20 != (lyd_meta *)0x0) {
    return meta2._4_4_;
  }
  __assert_fail("meta2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x634,"uint32_t get_meta_pos(struct lyd_meta *)");
}

Assistant:

static uint32_t
get_meta_pos(struct lyd_meta *meta)
{
    uint32_t pos = 0;
    struct lyd_meta *meta2;

    for (meta2 = meta->parent->meta; meta2 && (meta2 != meta); meta2 = meta2->next) {
        ++pos;
    }

    assert(meta2);
    return pos;
}